

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::CleanUpInlineCaches<false>(FunctionBody *this)

{
  InlineCache *this_00;
  IsInstInlineCache *this_01;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  PropertyId PVar4;
  uint uVar5;
  RootObjectBase *this_02;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar6;
  FunctionBodyPolymorphicInlineCache *pFVar7;
  IsInstInlineCache *inlineCache_1;
  ulong uVar8;
  uint i_1;
  ulong uVar9;
  InlineCache *inlineCache;
  anon_class_16_2_3f4a2e36 fn;
  anon_class_16_2_3f4a2e36 fn_00;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_40;
  Type runtimeData;
  
  runtimeData.ptr._4_4_ = 0;
  if ((this->inlineCaches).ptr != (void **)0x0) {
    uVar2 = GetRootObjectLoadInlineCacheStart(this);
    uVar9 = (ulong)uVar2;
    uVar2 = 0;
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      this_00 = (InlineCache *)(this->inlineCaches).ptr[uVar8];
      if (this_00 != (InlineCache *)0x0) {
        bVar1 = InlineCache::RemoveFromInvalidationList(this_00);
        uVar2 = uVar2 + bVar1;
        Memory::
        DeleteObject<Memory::InlineCacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::InlineCache>
                  (&((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                    inlineCacheAllocator,this_00);
      }
    }
    this_02 = GetRootObject(this);
    uVar3 = GetRootObjectLoadMethodInlineCacheStart(this);
    for (; uVar9 < uVar3; uVar9 = uVar9 + 1) {
      if ((this->inlineCaches).ptr[uVar9] != (void *)0x0) {
        PVar4 = GetPropertyIdFromCacheId(this,(uint)uVar9);
        uVar5 = RootObjectBase::ReleaseInlineCache(this_02,PVar4,false,false,false);
        uVar2 = uVar2 + uVar5;
      }
    }
    uVar3 = GetRootObjectStoreInlineCacheStart(this);
    for (; uVar9 < uVar3; uVar9 = uVar9 + 1) {
      if ((this->inlineCaches).ptr[uVar9] != (void *)0x0) {
        PVar4 = GetPropertyIdFromCacheId(this,(uint)uVar9);
        uVar5 = RootObjectBase::ReleaseInlineCache(this_02,PVar4,true,false,false);
        uVar2 = uVar2 + uVar5;
      }
    }
    uVar3 = GetInlineCacheCount(this);
    for (; uVar9 < uVar3; uVar9 = uVar9 + 1) {
      if ((this->inlineCaches).ptr[uVar9] != (void *)0x0) {
        PVar4 = GetPropertyIdFromCacheId(this,(uint)uVar9);
        uVar5 = RootObjectBase::ReleaseInlineCache(this_02,PVar4,false,true,false);
        uVar2 = uVar2 + uVar5;
      }
    }
    runtimeData.ptr._4_4_ = uVar2;
    uVar2 = GetInlineCacheCount(this);
    uVar3 = GetIsInstInlineCacheCount(this);
    for (; uVar9 < uVar3 + uVar2; uVar9 = uVar9 + 1) {
      this_01 = (IsInstInlineCache *)(this->inlineCaches).ptr[uVar9];
      if (this_01 != (IsInstInlineCache *)0x0) {
        IsInstInlineCache::Unregister
                  (this_01,(this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
        Memory::
        DeleteObject<Memory::CacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::IsInstInlineCache>
                  (&((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                    isInstInlineCacheAllocator,this_01);
      }
    }
    (this->inlineCaches).ptr = (void **)0x0;
  }
  pWVar6 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)11,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  if (pWVar6 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    for (uVar8 = 0; uVar8 < this->profiledCallSiteCount; uVar8 = uVar8 + 1) {
      if (pWVar6[uVar8].ptr != (FunctionCodeGenRuntimeData *)0x0) {
        fn.this = this;
        fn.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<false>()::_lambda(Js::InlineCache*)_1_>
                  (pWVar6[uVar8].ptr,fn);
      }
    }
  }
  pWVar6 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)8,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  if (pWVar6 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    uVar8 = 0;
    while( true ) {
      uVar2 = GetInlineCacheCount(this);
      if (uVar2 <= uVar8) break;
      Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr(&local_40,pWVar6);
      if (local_40.ptr != (FunctionCodeGenRuntimeData *)0x0) {
        fn_00.this = this;
        fn_00.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<false>()::_lambda(Js::InlineCache*)_2_>
                  (local_40.ptr,fn_00);
      }
      uVar8 = uVar8 + 1;
      pWVar6 = pWVar6 + 1;
    }
  }
  if (runtimeData.ptr._4_4_ != 0) {
    ThreadContext::NotifyInlineCacheBatchUnregistered
              (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               threadContext,runtimeData.ptr._4_4_);
  }
  while( true ) {
    pFVar7 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)12,Js::FunctionBodyPolymorphicInlineCache*>
                       ((FunctionProxy *)this);
    if (pFVar7 == (FunctionBodyPolymorphicInlineCache *)0x0) break;
    pFVar7 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)12,Js::FunctionBodyPolymorphicInlineCache*>
                       ((FunctionProxy *)this);
    FunctionBodyPolymorphicInlineCache::Finalize(pFVar7,false);
  }
  (this->polymorphicInlineCaches).inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->polymorphicInlineCaches).inlineCacheCount = 0;
  return;
}

Assistant:

void FunctionBody::CleanUpInlineCaches()
    {
        uint unregisteredInlineCacheCount = 0;

        if (nullptr != this->inlineCaches)
        {
            // Inline caches are in this order
            //      plain inline cache
            //      root object load inline cache
            //      root object store inline cache
            //      isInst inline cache
            // The inlineCacheCount includes all but isInst inline cache

            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            for (; i < plainInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            RootObjectBase * rootObjectBase = this->GetRootObject();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), true, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectStoreInlineCacheEnd = this->GetInlineCacheCount();
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, true, IsScriptContextShutdown);
                    }
                }
            }

            uint totalCacheCount = GetInlineCacheCount() + GetIsInstInlineCacheCount();
            for (; i < totalCacheCount; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    IsInstInlineCache* inlineCache = (IsInstInlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        inlineCache->Unregister(this->m_scriptContext);
                        AllocatorDelete(CacheAllocator, this->m_scriptContext->GetIsInstInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            this->inlineCaches = nullptr;

        }

        auto codeGenRuntimeData = this->GetCodeGenRuntimeData();
        if (nullptr != codeGenRuntimeData)
        {
            for (ProfileId i = 0; i < this->profiledCallSiteCount; i++)
            {
                const FunctionCodeGenRuntimeData* runtimeData = codeGenRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        if (codeGenGetSetRuntimeData != nullptr)
        {
            for (uint i = 0; i < this->GetInlineCacheCount(); i++)
            {
                auto runtimeData = codeGenGetSetRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        if (unregisteredInlineCacheCount > 0)
        {
            AssertMsg(!IsScriptContextShutdown, "Unregistration of inlineCache should only be done if this is not scriptContext shutdown.");
            ThreadContext* threadContext = this->m_scriptContext->GetThreadContext();
            threadContext->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }

        while (this->GetPolymorphicInlineCachesHead())
        {
            this->GetPolymorphicInlineCachesHead()->Finalize(IsScriptContextShutdown);
        }
        polymorphicInlineCaches.Reset();
    }